

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseSDDecl(xmlParserCtxtPtr ctxt)

{
  int local_1c;
  int standalone;
  xmlParserCtxtPtr ctxt_local;
  
  local_1c = -2;
  xmlSkipBlankChars(ctxt);
  if (((((((*ctxt->input->cur == 's') && (ctxt->input->cur[1] == 't')) &&
         (ctxt->input->cur[2] == 'a')) &&
        ((ctxt->input->cur[3] == 'n' && (ctxt->input->cur[4] == 'd')))) &&
       ((ctxt->input->cur[5] == 'a' &&
        ((ctxt->input->cur[6] == 'l' && (ctxt->input->cur[7] == 'o')))))) &&
      (ctxt->input->cur[8] == 'n')) && (ctxt->input->cur[9] == 'e')) {
    ctxt->input->cur = ctxt->input->cur + 10;
    ctxt->input->col = ctxt->input->col + 10;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur != '=') {
      xmlFatalErr(ctxt,XML_ERR_EQUAL_REQUIRED,(char *)0x0);
      return -2;
    }
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur == '\'') {
      xmlNextChar(ctxt);
      if ((*ctxt->input->cur == 'n') && (ctxt->input->cur[1] == 'o')) {
        local_1c = 0;
        ctxt->input->cur = ctxt->input->cur + 2;
        ctxt->input->col = ctxt->input->col + 2;
        if (*ctxt->input->cur == '\0') {
          xmlParserGrow(ctxt);
        }
      }
      else if ((*ctxt->input->cur == 'y') &&
              ((ctxt->input->cur[1] == 'e' && (ctxt->input->cur[2] == 's')))) {
        local_1c = 1;
        ctxt->input->cur = ctxt->input->cur + 3;
        ctxt->input->col = ctxt->input->col + 3;
        if (*ctxt->input->cur == '\0') {
          xmlParserGrow(ctxt);
        }
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_STANDALONE_VALUE,(char *)0x0);
      }
      if (*ctxt->input->cur == '\'') {
        xmlNextChar(ctxt);
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
      }
    }
    else if (*ctxt->input->cur == '\"') {
      xmlNextChar(ctxt);
      if ((*ctxt->input->cur == 'n') && (ctxt->input->cur[1] == 'o')) {
        local_1c = 0;
        ctxt->input->cur = ctxt->input->cur + 2;
        ctxt->input->col = ctxt->input->col + 2;
        if (*ctxt->input->cur == '\0') {
          xmlParserGrow(ctxt);
        }
      }
      else if ((*ctxt->input->cur == 'y') &&
              ((ctxt->input->cur[1] == 'e' && (ctxt->input->cur[2] == 's')))) {
        local_1c = 1;
        ctxt->input->cur = ctxt->input->cur + 3;
        ctxt->input->col = ctxt->input->col + 3;
        if (*ctxt->input->cur == '\0') {
          xmlParserGrow(ctxt);
        }
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_STANDALONE_VALUE,(char *)0x0);
      }
      if (*ctxt->input->cur == '\"') {
        xmlNextChar(ctxt);
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_STRING_NOT_STARTED,(char *)0x0);
    }
  }
  return local_1c;
}

Assistant:

int
xmlParseSDDecl(xmlParserCtxtPtr ctxt) {
    int standalone = -2;

    SKIP_BLANKS;
    if (CMP10(CUR_PTR, 's', 't', 'a', 'n', 'd', 'a', 'l', 'o', 'n', 'e')) {
	SKIP(10);
        SKIP_BLANKS;
	if (RAW != '=') {
	    xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
	    return(standalone);
        }
	NEXT;
	SKIP_BLANKS;
        if (RAW == '\''){
	    NEXT;
	    if ((RAW == 'n') && (NXT(1) == 'o')) {
	        standalone = 0;
                SKIP(2);
	    } else if ((RAW == 'y') && (NXT(1) == 'e') &&
	               (NXT(2) == 's')) {
	        standalone = 1;
		SKIP(3);
            } else {
		xmlFatalErr(ctxt, XML_ERR_STANDALONE_VALUE, NULL);
	    }
	    if (RAW != '\'') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else if (RAW == '"'){
	    NEXT;
	    if ((RAW == 'n') && (NXT(1) == 'o')) {
	        standalone = 0;
		SKIP(2);
	    } else if ((RAW == 'y') && (NXT(1) == 'e') &&
	               (NXT(2) == 's')) {
	        standalone = 1;
                SKIP(3);
            } else {
		xmlFatalErr(ctxt, XML_ERR_STANDALONE_VALUE, NULL);
	    }
	    if (RAW != '"') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
        }
    }
    return(standalone);
}